

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  string *__x;
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  TagAlias *pTVar4;
  domain_error *pdVar5;
  char *pcVar6;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TagAlias>_>::value,_pair<iterator,_bool>_>
  _Var7;
  byte local_4c2;
  Colour local_47a;
  Colour local_479;
  Option<Catch::TagAlias> local_478;
  Colour local_432;
  Colour local_431;
  ostringstream local_430 [8];
  ostringstream oss_1;
  TagAlias local_298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  local_268;
  _Base_ptr local_218;
  byte local_210;
  undefined1 local_201;
  Colour local_1da;
  Colour local_1d9;
  ostringstream local_1d8 [8];
  ostringstream oss;
  allocator local_49;
  string local_48;
  SourceLineInfo *local_28;
  SourceLineInfo *lineInfo_local;
  string *tag_local;
  string *alias_local;
  TagAliasRegistry *this_local;
  
  local_28 = lineInfo;
  lineInfo_local = (SourceLineInfo *)tag;
  tag_local = alias;
  alias_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"[@",&local_49);
  bVar1 = startsWith(alias,&local_48);
  local_4c2 = 1;
  if (bVar1) {
    bVar1 = endsWith(tag_local,']');
    local_4c2 = bVar1 ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  __x = tag_local;
  if ((local_4c2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    Colour::Colour(&local_1d9,Red);
    poVar3 = Catch::operator<<((ostream *)local_1d8,&local_1d9);
    poVar3 = std::operator<<(poVar3,"error: tag alias, \"");
    poVar3 = std::operator<<(poVar3,(string *)tag_local);
    poVar3 = std::operator<<(poVar3,"\" is not of the form [@alias name].\n");
    Colour::Colour(&local_1da,FileName);
    poVar3 = Catch::operator<<(poVar3,&local_1da);
    poVar3 = Catch::operator<<(poVar3,local_28);
    std::operator<<(poVar3,'\n');
    Colour::~Colour(&local_1da);
    Colour::~Colour(&local_1d9);
    local_201 = 1;
    pdVar5 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::domain_error::domain_error(pdVar5,pcVar6);
    local_201 = 0;
    __cxa_throw(pdVar5,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  TagAlias::TagAlias(&local_298,(string *)lineInfo_local,*local_28);
  std::make_pair<std::__cxx11::string_const&,Catch::TagAlias>(&local_268,__x,&local_298);
  _Var7 = std::
          map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::insert<std::pair<std::__cxx11::string,Catch::TagAlias>>
                    ((map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                      *)&this->m_registry,&local_268);
  local_218 = (_Base_ptr)_Var7.first._M_node;
  local_210 = _Var7.second;
  bVar2 = local_210 ^ 0xff;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  ::~pair(&local_268);
  TagAlias::~TagAlias(&local_298);
  if ((bVar2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_430);
    Colour::Colour(&local_431,Red);
    poVar3 = Catch::operator<<((ostream *)local_430,&local_431);
    poVar3 = std::operator<<(poVar3,"error: tag alias, \"");
    poVar3 = std::operator<<(poVar3,(string *)tag_local);
    poVar3 = std::operator<<(poVar3,"\" already registered.\n");
    poVar3 = std::operator<<(poVar3,"\tFirst seen at ");
    Colour::Colour(&local_432,Red);
    poVar3 = Catch::operator<<(poVar3,&local_432);
    (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_478,this,tag_local);
    pTVar4 = Option<Catch::TagAlias>::operator->(&local_478);
    poVar3 = Catch::operator<<(poVar3,&pTVar4->lineInfo);
    poVar3 = std::operator<<(poVar3,'\n');
    Colour::Colour(&local_479,Red);
    poVar3 = Catch::operator<<(poVar3,&local_479);
    poVar3 = std::operator<<(poVar3,"\tRedefined at ");
    Colour::Colour(&local_47a,FileName);
    poVar3 = Catch::operator<<(poVar3,&local_47a);
    poVar3 = Catch::operator<<(poVar3,local_28);
    std::operator<<(poVar3,'\n');
    Colour::~Colour(&local_47a);
    Colour::~Colour(&local_479);
    Option<Catch::TagAlias>::~Option(&local_478);
    Colour::~Colour(&local_432);
    Colour::~Colour(&local_431);
    pdVar5 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::domain_error::domain_error(pdVar5,pcVar6);
    __cxa_throw(pdVar5,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return;
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, ']' ) ) {
            std::ostringstream oss;
            oss << Colour( Colour::Red )
                << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n"
                << Colour( Colour::FileName )
                << lineInfo << '\n';
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << Colour( Colour::Red )
                << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at "
                << Colour( Colour::Red ) << find(alias)->lineInfo << '\n'
                << Colour( Colour::Red ) << "\tRedefined at "
                << Colour( Colour::FileName) << lineInfo << '\n';
            throw std::domain_error( oss.str().c_str() );
        }
    }